

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> * __thiscall
spvtools::val::ValidationState_t::getSampledImageConsumers
          (vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
           *__return_storage_ptr__,ValidationState_t *this,uint32_t sampled_image_id)

{
  const_iterator cVar1;
  uint32_t local_c;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c = sampled_image_id;
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->sampled_image_consumers_)._M_h,&local_c);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>::
    operator=(__return_storage_ptr__,
              (vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_> *
              )((long)cVar1.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>,_false>
                      ._M_cur + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Instruction*> ValidationState_t::getSampledImageConsumers(
    uint32_t sampled_image_id) const {
  std::vector<Instruction*> result;
  auto iter = sampled_image_consumers_.find(sampled_image_id);
  if (iter != sampled_image_consumers_.end()) {
    result = iter->second;
  }
  return result;
}